

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamespaceScope.cpp
# Opt level: O1

void __thiscall xercesc_4_0::NamespaceScope::expandStack(NamespaceScope *this)

{
  int iVar1;
  undefined4 extraout_var;
  uint uVar2;
  ulong uVar3;
  StackElem **__dest;
  
  uVar3 = (ulong)((double)this->fStackCapacity * 1.25);
  uVar2 = (uint)uVar3;
  iVar1 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                    (this->fMemoryManager,(uVar3 & 0xffffffff) << 3);
  __dest = (StackElem **)CONCAT44(extraout_var,iVar1);
  memcpy(__dest,this->fStack,(ulong)this->fStackCapacity << 3);
  memset(__dest + this->fStackCapacity,0,(ulong)(uVar2 - this->fStackCapacity) << 3);
  (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fStack);
  this->fStack = __dest;
  this->fStackCapacity = uVar2;
  return;
}

Assistant:

void NamespaceScope::expandStack()
{
    // Expand the capacity by 25% and allocate a new buffer
    const unsigned int newCapacity = (unsigned int)(fStackCapacity * 1.25);
    StackElem** newStack = (StackElem**) fMemoryManager->allocate
    (
        newCapacity * sizeof(StackElem*)
    );//new StackElem*[newCapacity];

    // Copy over the old stuff
    memcpy(newStack, fStack, fStackCapacity * sizeof(StackElem*));

    //
    //  And zero out the new stuff. Though we use a stack top, we reuse old
    //  stack contents so we need to know if elements have been initially
    //  allocated or not as we push new stuff onto the stack.
    //
    memset
    (
        &newStack[fStackCapacity]
        , 0
        , (newCapacity - fStackCapacity) * sizeof(StackElem*)
    );

    // Delete the old array and update our members
    fMemoryManager->deallocate(fStack);//delete [] fStack;
    fStack = newStack;
    fStackCapacity = newCapacity;
}